

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeUpdateVisibleFlag(ImGuiDockNode *node)

{
  byte local_14;
  byte local_13;
  bool local_12;
  bool is_visible;
  ImGuiDockNode *node_local;
  
  if (node->ParentNode == (ImGuiDockNode *)0x0) {
    local_12 = ImGuiDockNode::IsDockSpace(node);
  }
  else {
    local_12 = ImGuiDockNode::IsCentralNode(node);
  }
  local_13 = 0;
  if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
    local_13 = (byte)((ushort)*(undefined2 *)&node->ChildNodes[0]->field_0xb8 >> 9) & 1;
  }
  local_14 = 0;
  if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
    local_14 = (byte)((ushort)*(undefined2 *)&node->ChildNodes[1]->field_0xb8 >> 9) & 1;
  }
  *(ushort *)&node->field_0xb8 =
       *(ushort *)&node->field_0xb8 & 0xfdff |
       (ushort)(((local_12 != false || 0 < (node->Windows).Size) || local_13 != 0) || local_14 != 0)
       << 9;
  return;
}

Assistant:

static void ImGui::DockNodeUpdateVisibleFlag(ImGuiDockNode* node)
{
    // Update visibility flag
    bool is_visible = (node->ParentNode == NULL) ? node->IsDockSpace() : node->IsCentralNode();
    is_visible |= (node->Windows.Size > 0);
    is_visible |= (node->ChildNodes[0] && node->ChildNodes[0]->IsVisible);
    is_visible |= (node->ChildNodes[1] && node->ChildNodes[1]->IsVisible);
    node->IsVisible = is_visible;
}